

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_test.cc
# Opt level: O3

void __thiscall PoolTest_Pooled_Test::TestBody(PoolTest_Pooled_Test *this)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  CRYPTO_BUFFER *pCVar2;
  uint8_t *puVar3;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr;
  bool bVar5;
  UniquePtr<CRYPTO_BUFFER> buf7;
  UniquePtr<CRYPTO_BUFFER> buf4;
  UniquePtr<CRYPTO_BUFFER> buf3;
  UniquePtr<CRYPTO_BUFFER> buf5;
  UniquePtr<CRYPTO_BUFFER> buf;
  UniquePtr<CRYPTO_BUFFER> buf6;
  UniquePtr<CRYPTO_BUFFER_POOL> pool;
  UniquePtr<CRYPTO_BUFFER> buf2;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  undefined1 local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  Bytes local_60;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  _Head_base<0UL,_crypto_buffer_st_*,_false> local_30;
  _Head_base<0UL,_crypto_buffer_pool_st_*,_false> local_28;
  AssertHelper local_20;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_18;
  
  local_28._M_head_impl = CRYPTO_BUFFER_POOL_new();
  local_90[0] = local_28._M_head_impl != (CRYPTO_BUFFER_POOL *)0x0;
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28._M_head_impl == (CRYPTO_BUFFER_POOL *)0x0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_80,(internal *)local_90,(AssertionResult *)0x5abaf7,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
               ,0x43,(char *)CONCAT71(local_80._1_7_,local_80[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_80._1_7_,local_80[0]) != &local_70) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_80._1_7_,local_80[0]),local_70._M_allocated_capacity + 1);
    }
    if ((CRYPTO_BUFFER *)local_60.span_.data_ != (CRYPTO_BUFFER *)0x0) {
      (*(code *)((*(CRYPTO_BUFFER_POOL **)local_60.span_.data_)->lock).__align)();
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
    goto LAB_0034ee17;
  }
  local_38._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )CRYPTO_BUFFER_new("\x01\x02\x03\x04",4,local_28._M_head_impl);
  local_90[0] = (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 )local_38._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 )0x0;
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )local_38._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl ==
      (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )0x0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_80,(internal *)local_90,(AssertionResult *)0x55fc2f,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_18,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
               ,0x48,(char *)CONCAT71(local_80._1_7_,local_80[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_18,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_80._1_7_,local_80[0]) != &local_70) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_80._1_7_,local_80[0]),local_70._M_allocated_capacity + 1);
    }
    if ((CRYPTO_BUFFER *)local_60.span_.data_ != (CRYPTO_BUFFER *)0x0) {
      (*(code *)((*(CRYPTO_BUFFER_POOL **)local_60.span_.data_)->lock).__align)();
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
  }
  else {
    local_90 = (undefined1  [8])0x55f6d8;
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
    pCVar2 = (CRYPTO_BUFFER *)
             CRYPTO_BUFFER_data((CRYPTO_BUFFER *)
                                local_38._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
    local_60.span_.size_ =
         CRYPTO_BUFFER_len((CRYPTO_BUFFER *)
                           local_38._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
    local_60.span_.data_ = (uchar *)pCVar2;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_80,"Bytes(kData1)",
               "Bytes(CRYPTO_BUFFER_data(buf.get()), CRYPTO_BUFFER_len(buf.get()))",
               (Bytes *)local_90,&local_60);
    if (local_80[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_90);
      if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_78->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                 ,0x4a,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_90);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
      if (local_90 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_90 + 8))();
      }
    }
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    local_18._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CRYPTO_BUFFER_new("\x01\x02\x03\x04",4,local_28._M_head_impl);
    local_90[0] = (CRYPTO_BUFFER *)local_18._M_head_impl != (CRYPTO_BUFFER *)0x0;
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((CRYPTO_BUFFER *)local_18._M_head_impl == (CRYPTO_BUFFER *)0x0) {
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_80,(internal *)local_90,(AssertionResult *)"buf2","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                 ,0x4e,(char *)CONCAT71(local_80._1_7_,local_80[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_80._1_7_,local_80[0]) != &local_70) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_80._1_7_,local_80[0]),local_70._M_allocated_capacity + 1);
      }
      if ((CRYPTO_BUFFER *)local_60.span_.data_ != (CRYPTO_BUFFER *)0x0) {
        (*(code *)((*(CRYPTO_BUFFER_POOL **)local_60.span_.data_)->lock).__align)();
      }
      if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_88,local_88);
      }
    }
    else {
      local_90 = (undefined1  [8])0x55f6d8;
      local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
      puVar3 = CRYPTO_BUFFER_data((CRYPTO_BUFFER *)local_18._M_head_impl);
      local_60.span_.size_ = CRYPTO_BUFFER_len((CRYPTO_BUFFER *)local_18._M_head_impl);
      local_60.span_.data_ = puVar3;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_80,"Bytes(kData1)",
                 "Bytes(CRYPTO_BUFFER_data(buf2.get()), CRYPTO_BUFFER_len(buf2.get()))",
                 (Bytes *)local_90,&local_60);
      if (local_80[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_90);
        if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = (local_78->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                   ,0x50,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_90);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
        if (local_90 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_90 + 8))();
        }
      }
      if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_78,local_78);
      }
      local_90 = (undefined1  [8])
                 local_38._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
      local_60.span_.data_ = (uchar *)local_18._M_head_impl;
      testing::internal::CmpHelperEQ<crypto_buffer_st*,crypto_buffer_st*>
                ((internal *)local_80,"buf.get()","buf2.get()",(crypto_buffer_st **)local_90,
                 (crypto_buffer_st **)&local_60);
      if (local_80[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_90);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)local_90 + 0x10),"CRYPTO_BUFFER_POOL did not dedup data.",0x26)
        ;
        if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = (local_78->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                   ,0x52,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_90);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
        if (local_90 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_90 + 8))();
        }
      }
      if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_78,local_78);
      }
      local_48._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CRYPTO_BUFFER_new("\x05\x06\a\b",4,local_28._M_head_impl);
      local_90[0] = (CRYPTO_BUFFER *)local_48._M_head_impl != (CRYPTO_BUFFER *)0x0;
      local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((CRYPTO_BUFFER *)local_48._M_head_impl == (CRYPTO_BUFFER *)0x0) {
        testing::Message::Message((Message *)&local_60);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_80,(internal *)local_90,(AssertionResult *)"buf3","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                   ,0x58,(char *)CONCAT71(local_80._1_7_,local_80[0]));
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_60);
LAB_0034e661:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_80._1_7_,local_80[0]) != &local_70) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_80._1_7_,local_80[0]),local_70._M_allocated_capacity + 1
                         );
        }
        if ((CRYPTO_BUFFER *)local_60.span_.data_ != (CRYPTO_BUFFER *)0x0) {
          (*(code *)((*(CRYPTO_BUFFER_POOL **)local_60.span_.data_)->lock).__align)();
        }
        if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_88,local_88);
        }
      }
      else {
        local_90 = (undefined1  [8])0x55f6dc;
        local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
        puVar3 = CRYPTO_BUFFER_data((CRYPTO_BUFFER *)local_48._M_head_impl);
        local_60.span_.size_ = CRYPTO_BUFFER_len((CRYPTO_BUFFER *)local_48._M_head_impl);
        local_60.span_.data_ = puVar3;
        testing::internal::CmpHelperEQ<Bytes,Bytes>
                  ((internal *)local_80,"Bytes(kData2)",
                   "Bytes(CRYPTO_BUFFER_data(buf3.get()), CRYPTO_BUFFER_len(buf3.get()))",
                   (Bytes *)local_90,&local_60);
        if (local_80[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_90);
          if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_78->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                     ,0x5a,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_90);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
          if (local_90 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_90 + 8))();
          }
        }
        if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_78,local_78);
        }
        local_90 = (undefined1  [8])
                   local_38._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
        local_60.span_.data_ = (uchar *)local_48._M_head_impl;
        testing::internal::CmpHelperNE<crypto_buffer_st*,crypto_buffer_st*>
                  ((internal *)local_80,"buf.get()","buf3.get()",(crypto_buffer_st **)local_90,
                   (crypto_buffer_st **)&local_60);
        if (local_80[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_90);
          if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_78->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                     ,0x5b,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_90);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
          if (local_90 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_90 + 8))();
          }
        }
        if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_78,local_78);
        }
        _Var1._M_head_impl = local_48._M_head_impl;
        local_48._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((CRYPTO_BUFFER *)_Var1._M_head_impl != (CRYPTO_BUFFER *)0x0) {
          CRYPTO_BUFFER_free((CRYPTO_BUFFER *)_Var1._M_head_impl);
        }
        local_60.span_.data_ = (uchar *)CONCAT44(local_60.span_.data_._4_4_,1);
        local_90 = (undefined1  [8])OPENSSL_lh_num_items((_LHASH *)(local_28._M_head_impl)->bufs);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)local_80,"1u","lh_CRYPTO_BUFFER_num_items(pool->bufs)",
                   (uint *)&local_60,(unsigned_long *)local_90);
        if (local_80[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_90);
          if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_78->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                     ,0x5f,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_90);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
          if (local_90 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_90 + 8))();
          }
        }
        if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_78,local_78);
        }
        pCVar2 = CRYPTO_BUFFER_new_from_static_data_unsafe("\x05\x06\a\b",4,local_28._M_head_impl);
        _Var1._M_head_impl = local_48._M_head_impl;
        bVar5 = (CRYPTO_BUFFER *)local_48._M_head_impl != (CRYPTO_BUFFER *)0x0;
        local_48._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar2;
        if (bVar5) {
          CRYPTO_BUFFER_free((CRYPTO_BUFFER *)_Var1._M_head_impl);
        }
        local_90[0] = (CRYPTO_BUFFER *)local_48._M_head_impl != (CRYPTO_BUFFER *)0x0;
        local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((CRYPTO_BUFFER *)local_48._M_head_impl == (CRYPTO_BUFFER *)0x0) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_80,(internal *)local_90,(AssertionResult *)"buf3","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_40,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                     ,100,(char *)CONCAT71(local_80._1_7_,local_80[0]));
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_60)
          ;
          goto LAB_0034e661;
        }
        local_90 = (undefined1  [8])CRYPTO_BUFFER_data((CRYPTO_BUFFER *)local_48._M_head_impl);
        testing::internal::CmpHelperEQ<unsigned_char[4],unsigned_char_const*>
                  ((internal *)local_80,"kData2","CRYPTO_BUFFER_data(buf3.get())",
                   (uchar (*) [4])"\x05\x06\a\b",(uchar **)local_90);
        if (local_80[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_90);
          if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_78->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                     ,0x65,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_90);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
          if (local_90 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_90 + 8))();
          }
        }
        if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_78,local_78);
        }
        local_90 = (undefined1  [8])0x4;
        local_60.span_.data_ = (uchar *)CRYPTO_BUFFER_len((CRYPTO_BUFFER *)local_48._M_head_impl);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_80,"sizeof(kData2)","CRYPTO_BUFFER_len(buf3.get())",
                   (unsigned_long *)local_90,(unsigned_long *)&local_60);
        if (local_80[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_90);
          if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_78->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                     ,0x66,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_90);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
          if (local_90 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_90 + 8))();
          }
        }
        if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_78,local_78);
        }
        local_90 = (undefined1  [8])
                   local_38._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
        local_60.span_.data_ = (uchar *)local_48._M_head_impl;
        testing::internal::CmpHelperNE<crypto_buffer_st*,crypto_buffer_st*>
                  ((internal *)local_80,"buf.get()","buf3.get()",(crypto_buffer_st **)local_90,
                   (crypto_buffer_st **)&local_60);
        if (local_80[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_90);
          if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_78->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                     ,0x67,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_90);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
          if (local_90 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_90 + 8))();
          }
        }
        if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_78,local_78);
        }
        local_90 = (undefined1  [8])CRYPTO_BUFFER_new("\x05\x06\a\b",4,local_28._M_head_impl);
        local_40._M_head_impl = local_48._M_head_impl;
        local_60.span_.data_ = (uchar *)local_90;
        testing::internal::CmpHelperEQ<crypto_buffer_st*,crypto_buffer_st*>
                  ((internal *)local_80,"buf4.get()","buf3.get()",(crypto_buffer_st **)local_90,
                   (crypto_buffer_st **)&local_40);
        if (local_80[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_90);
          if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_78->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_40,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                     ,0x6b,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)local_90);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
          if (local_90 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_90 + 8))();
          }
        }
        if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_78,local_78);
        }
        local_90 = (undefined1  [8])
                   CRYPTO_BUFFER_new_from_static_data_unsafe("\x05\x06\a\b",4,local_28._M_head_impl)
        ;
        local_30._M_head_impl = (crypto_buffer_st *)local_48._M_head_impl;
        local_40._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90;
        testing::internal::CmpHelperEQ<crypto_buffer_st*,crypto_buffer_st*>
                  ((internal *)local_80,"buf5.get()","buf3.get()",(crypto_buffer_st **)local_90,
                   &local_30._M_head_impl);
        if (local_80[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_90);
          if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_78->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_30,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                     ,0x6f,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_30,(Message *)local_90);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_30);
          if (local_90 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_90 + 8))();
          }
        }
        if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_78,local_78);
        }
        local_30._M_head_impl =
             CRYPTO_BUFFER_new_from_static_data_unsafe("\x01\x02\x03\x04",4,local_28._M_head_impl);
        local_90[0] = local_30._M_head_impl != (CRYPTO_BUFFER *)0x0;
        local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_30._M_head_impl == (CRYPTO_BUFFER *)0x0) {
          testing::Message::Message((Message *)&local_50);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_80,(internal *)local_90,(AssertionResult *)"buf6","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_20,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                     ,0x75,(char *)CONCAT71(local_80._1_7_,local_80[0]));
          testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&local_20);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_80._1_7_,local_80[0]) != &local_70) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_80._1_7_,local_80[0]),
                            local_70._M_allocated_capacity + 1);
          }
          if ((CRYPTO_BUFFER *)local_50._M_head_impl != (CRYPTO_BUFFER *)0x0) {
            (**(code **)(*(long *)local_50._M_head_impl + 8))();
          }
          if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_88,local_88);
          }
        }
        else {
          local_90 = (undefined1  [8])CRYPTO_BUFFER_data(local_30._M_head_impl);
          testing::internal::CmpHelperEQ<unsigned_char[4],unsigned_char_const*>
                    ((internal *)local_80,"kData1","CRYPTO_BUFFER_data(buf6.get())",
                     (uchar (*) [4])"\x01\x02\x03\x04",(uchar **)local_90);
          if (local_80[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_90);
            if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar4 = "";
            }
            else {
              pcVar4 = (local_78->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                       ,0x76,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_50,(Message *)local_90);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
            if (local_90 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_90 + 8))();
            }
          }
          if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_78,local_78);
          }
          local_90 = (undefined1  [8])0x4;
          local_50._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CRYPTO_BUFFER_len(local_30._M_head_impl);
          testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                    ((internal *)local_80,"sizeof(kData1)","CRYPTO_BUFFER_len(buf6.get())",
                     (unsigned_long *)local_90,(unsigned_long *)&local_50);
          if (local_80[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_90);
            if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar4 = "";
            }
            else {
              pcVar4 = (local_78->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                       ,0x77,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_50,(Message *)local_90);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
            if (local_90 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_90 + 8))();
            }
          }
          if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_78,local_78);
          }
          local_90 = (undefined1  [8])
                     local_38._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
          local_50._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_30._M_head_impl;
          testing::internal::CmpHelperNE<crypto_buffer_st*,crypto_buffer_st*>
                    ((internal *)local_80,"buf.get()","buf6.get()",(crypto_buffer_st **)local_90,
                     (crypto_buffer_st **)&local_50);
          if (local_80[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_90);
            if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar4 = "";
            }
            else {
              pcVar4 = (local_78->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                       ,0x78,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_50,(Message *)local_90);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
            if (local_90 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_90 + 8))();
            }
          }
          if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_78,local_78);
          }
          local_90 = (undefined1  [8])CRYPTO_BUFFER_new("\x01\x02\x03\x04",4,local_28._M_head_impl);
          local_20.data_ = (AssertHelperData *)local_30._M_head_impl;
          local_50._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90;
          testing::internal::CmpHelperEQ<crypto_buffer_st*,crypto_buffer_st*>
                    ((internal *)local_80,"buf7.get()","buf6.get()",(crypto_buffer_st **)&local_50,
                     (crypto_buffer_st **)&local_20);
          if (local_80[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_50);
            if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar4 = "";
            }
            else {
              pcVar4 = (local_78->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_20,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool_test.cc"
                       ,0x7d,pcVar4);
            testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_50);
            testing::internal::AssertHelper::~AssertHelper(&local_20);
            if ((CRYPTO_BUFFER *)local_50._M_head_impl != (CRYPTO_BUFFER *)0x0) {
              (**(code **)(*(long *)local_50._M_head_impl + 8))();
            }
          }
          if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_78,local_78);
          }
          std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)local_90);
        }
        std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_30);
        std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_40);
        std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_60);
      }
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_48);
    }
    std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_18);
  }
  std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_38);
LAB_0034ee17:
  std::unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<crypto_buffer_pool_st,_bssl::internal::Deleter> *)&local_28);
  return;
}

Assistant:

TEST(PoolTest, Pooled) {
  bssl::UniquePtr<CRYPTO_BUFFER_POOL> pool(CRYPTO_BUFFER_POOL_new());
  ASSERT_TRUE(pool);

  static const uint8_t kData1[4] = {1, 2, 3, 4};
  bssl::UniquePtr<CRYPTO_BUFFER> buf(
      CRYPTO_BUFFER_new(kData1, sizeof(kData1), pool.get()));
  ASSERT_TRUE(buf);
  EXPECT_EQ(Bytes(kData1),
            Bytes(CRYPTO_BUFFER_data(buf.get()), CRYPTO_BUFFER_len(buf.get())));

  bssl::UniquePtr<CRYPTO_BUFFER> buf2(
      CRYPTO_BUFFER_new(kData1, sizeof(kData1), pool.get()));
  ASSERT_TRUE(buf2);
  EXPECT_EQ(Bytes(kData1), Bytes(CRYPTO_BUFFER_data(buf2.get()),
                                 CRYPTO_BUFFER_len(buf2.get())));

  EXPECT_EQ(buf.get(), buf2.get()) << "CRYPTO_BUFFER_POOL did not dedup data.";

  // Different inputs do not get deduped.
  static const uint8_t kData2[4] = {5, 6, 7, 8};
  bssl::UniquePtr<CRYPTO_BUFFER> buf3(
      CRYPTO_BUFFER_new(kData2, sizeof(kData2), pool.get()));
  ASSERT_TRUE(buf3);
  EXPECT_EQ(Bytes(kData2), Bytes(CRYPTO_BUFFER_data(buf3.get()),
                                 CRYPTO_BUFFER_len(buf3.get())));
  EXPECT_NE(buf.get(), buf3.get());

  // When the last refcount on |buf3| is dropped, it is removed from the pool.
  buf3 = nullptr;
  EXPECT_EQ(1u, lh_CRYPTO_BUFFER_num_items(pool->bufs));

  // Static buffers participate in pooling.
  buf3.reset(CRYPTO_BUFFER_new_from_static_data_unsafe(kData2, sizeof(kData2),
                                                       pool.get()));
  ASSERT_TRUE(buf3);
  EXPECT_EQ(kData2, CRYPTO_BUFFER_data(buf3.get()));
  EXPECT_EQ(sizeof(kData2), CRYPTO_BUFFER_len(buf3.get()));
  EXPECT_NE(buf.get(), buf3.get());

  bssl::UniquePtr<CRYPTO_BUFFER> buf4(
      CRYPTO_BUFFER_new(kData2, sizeof(kData2), pool.get()));
  EXPECT_EQ(buf4.get(), buf3.get());

  bssl::UniquePtr<CRYPTO_BUFFER> buf5(CRYPTO_BUFFER_new_from_static_data_unsafe(
      kData2, sizeof(kData2), pool.get()));
  EXPECT_EQ(buf5.get(), buf3.get());

  // When creating a static buffer, if there is already a non-static buffer, it
  // replaces the old buffer.
  bssl::UniquePtr<CRYPTO_BUFFER> buf6(CRYPTO_BUFFER_new_from_static_data_unsafe(
      kData1, sizeof(kData1), pool.get()));
  ASSERT_TRUE(buf6);
  EXPECT_EQ(kData1, CRYPTO_BUFFER_data(buf6.get()));
  EXPECT_EQ(sizeof(kData1), CRYPTO_BUFFER_len(buf6.get()));
  EXPECT_NE(buf.get(), buf6.get());

  // Subsequent lookups of |kData1| should return |buf6|.
  bssl::UniquePtr<CRYPTO_BUFFER> buf7(
      CRYPTO_BUFFER_new(kData1, sizeof(kData1), pool.get()));
  EXPECT_EQ(buf7.get(), buf6.get());
}